

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_QString_&>,_ProString>,_QString>::
convertTo<QString>(QString *__return_storage_ptr__,
                  QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_QString_&>,_ProString>,_QString>
                  *this)

{
  int iVar1;
  QString *pQVar2;
  QString *pQVar3;
  long lVar4;
  long lVar5;
  CutResult CVar6;
  char16_t *pcVar7;
  char16_t *__src;
  long lVar8;
  char16_t *pcVar9;
  long in_FS_OFFSET;
  long local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->a).a.a;
  pQVar3 = (this->a).a.b;
  if (((((pQVar2->d).ptr == (char16_t *)0x0) && ((pQVar3->d).ptr == (char16_t *)0x0)) &&
      ((this->a).b.m_string.d.ptr == (char16_t *)0x0)) && ((this->b).d.ptr == (char16_t *)0x0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00149d80;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    lVar8 = (pQVar3->d).size;
    lVar4 = (pQVar2->d).size;
    iVar1 = (this->a).b.m_length;
    lVar5 = (this->b).d.size;
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString(__return_storage_ptr__,(long)iVar1 + lVar8 + lVar4 + lVar5,Uninitialized);
    pcVar9 = (__return_storage_ptr__->d).ptr;
    pQVar2 = (this->a).a.a;
    lVar8 = (pQVar2->d).size;
    if (lVar8 != 0) {
      pcVar7 = (pQVar2->d).ptr;
      if (pcVar7 == (char16_t *)0x0) {
        pcVar7 = (char16_t *)&QString::_empty;
      }
      memcpy(pcVar9,pcVar7,lVar8 * 2);
    }
    pcVar9 = pcVar9 + lVar8;
    pQVar2 = (this->a).a.b;
    lVar8 = (pQVar2->d).size;
    if (lVar8 != 0) {
      pcVar7 = (pQVar2->d).ptr;
      if (pcVar7 == (char16_t *)0x0) {
        pcVar7 = (char16_t *)&QString::_empty;
      }
      memcpy(pcVar9,pcVar7,lVar8 * 2);
    }
    pcVar9 = pcVar9 + lVar8;
    lVar8 = (long)(this->a).b.m_length;
    if (lVar8 != 0) {
      pcVar7 = (this->a).b.m_string.d.ptr;
      local_40 = (long)(this->a).b.m_offset;
      local_48 = lVar8;
      CVar6 = QtPrivate::QContainerImplHelper::mid((this->a).b.m_string.d.size,&local_40,&local_48);
      __src = (char16_t *)0x0;
      if (CVar6 != Null) {
        __src = pcVar7 + local_40;
      }
      memcpy(pcVar9,__src,lVar8 * 2);
      pcVar9 = pcVar9 + lVar8;
    }
    lVar8 = (this->b).d.size;
    if (lVar8 != 0) {
      pcVar7 = (this->b).d.ptr;
      if (pcVar7 == (char16_t *)0x0) {
        pcVar7 = (char16_t *)&QString::_empty;
      }
      memcpy(pcVar9,pcVar7,lVar8 * 2);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_00149d80:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }